

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uchar uVar1;
  ulong uVar2;
  void *pvVar3;
  ulong local_28;
  unsigned_long available;
  unsigned_long used;
  MD5_CTX *ctx_local;
  uchar *result_local;
  
  uVar2 = (ulong)(c->A & 0x3f);
  available = uVar2 + 1;
  *(undefined1 *)((long)c->data + uVar2) = 0x80;
  local_28 = 0x40 - available;
  if (local_28 < 8) {
    memset((void *)((long)c->data + uVar2 + 1),0,local_28);
    body((MD5_CTX *)c,c->data,0x40);
    available = 0;
    local_28 = 0x40;
  }
  memset((void *)((long)c->data + available),0,local_28 - 8);
  c->A = c->A << 3;
  uVar1 = curlx_ultouc((ulong)(c->A & 0xff));
  *(uchar *)(c->data + 0xe) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->A >> 8 & 0xff));
  *(uchar *)((long)c->data + 0x39) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->A >> 0x10 & 0xff));
  *(uchar *)((long)c->data + 0x3a) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->A >> 0x18));
  *(uchar *)((long)c->data + 0x3b) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->B & 0xff));
  *(uchar *)(c->data + 0xf) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->B >> 8 & 0xff));
  *(uchar *)((long)c->data + 0x3d) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->B >> 0x10 & 0xff));
  *(uchar *)((long)c->data + 0x3e) = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->B >> 0x18));
  *(uchar *)((long)c->data + 0x3f) = uVar1;
  body((MD5_CTX *)c,c->data,0x40);
  uVar1 = curlx_ultouc((ulong)(c->C & 0xff));
  *md = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->C >> 8 & 0xff));
  md[1] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->C >> 0x10 & 0xff));
  md[2] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->C >> 0x18));
  md[3] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->D & 0xff));
  md[4] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->D >> 8 & 0xff));
  md[5] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->D >> 0x10 & 0xff));
  md[6] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->D >> 0x18));
  md[7] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nl & 0xff));
  md[8] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nl >> 8 & 0xff));
  md[9] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nl >> 0x10 & 0xff));
  md[10] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nl >> 0x18));
  md[0xb] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nh & 0xff));
  md[0xc] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nh >> 8 & 0xff));
  md[0xd] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nh >> 0x10 & 0xff));
  md[0xe] = uVar1;
  uVar1 = curlx_ultouc((ulong)(c->Nh >> 0x18));
  md[0xf] = uVar1;
  pvVar3 = memset(c,0,0x98);
  return (int)pvVar3;
}

Assistant:

static void MD5_Final(unsigned char *result, MD5_CTX *ctx)
{
  unsigned long used, available;

  used = ctx->lo & 0x3f;

  ctx->buffer[used++] = 0x80;

  available = 64 - used;

  if(available < 8) {
    memset(&ctx->buffer[used], 0, available);
    body(ctx, ctx->buffer, 64);
    used = 0;
    available = 64;
  }

  memset(&ctx->buffer[used], 0, available - 8);

  ctx->lo <<= 3;
  ctx->buffer[56] = curlx_ultouc((ctx->lo)&0xff);
  ctx->buffer[57] = curlx_ultouc((ctx->lo >> 8)&0xff);
  ctx->buffer[58] = curlx_ultouc((ctx->lo >> 16)&0xff);
  ctx->buffer[59] = curlx_ultouc(ctx->lo >> 24);
  ctx->buffer[60] = curlx_ultouc((ctx->hi)&0xff);
  ctx->buffer[61] = curlx_ultouc((ctx->hi >> 8)&0xff);
  ctx->buffer[62] = curlx_ultouc((ctx->hi >> 16)&0xff);
  ctx->buffer[63] = curlx_ultouc(ctx->hi >> 24);

  body(ctx, ctx->buffer, 64);

  result[0] = curlx_ultouc((ctx->a)&0xff);
  result[1] = curlx_ultouc((ctx->a >> 8)&0xff);
  result[2] = curlx_ultouc((ctx->a >> 16)&0xff);
  result[3] = curlx_ultouc(ctx->a >> 24);
  result[4] = curlx_ultouc((ctx->b)&0xff);
  result[5] = curlx_ultouc((ctx->b >> 8)&0xff);
  result[6] = curlx_ultouc((ctx->b >> 16)&0xff);
  result[7] = curlx_ultouc(ctx->b >> 24);
  result[8] = curlx_ultouc((ctx->c)&0xff);
  result[9] = curlx_ultouc((ctx->c >> 8)&0xff);
  result[10] = curlx_ultouc((ctx->c >> 16)&0xff);
  result[11] = curlx_ultouc(ctx->c >> 24);
  result[12] = curlx_ultouc((ctx->d)&0xff);
  result[13] = curlx_ultouc((ctx->d >> 8)&0xff);
  result[14] = curlx_ultouc((ctx->d >> 16)&0xff);
  result[15] = curlx_ultouc(ctx->d >> 24);

  memset(ctx, 0, sizeof(*ctx));
}